

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[4]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [7])

{
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  SiPair *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::_::(anonymous_namespace)::SiPair> AVar3;
  unsigned_long *pos;
  SiPair *local_50;
  char (*local_48) [7];
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  char (*params_local) [7];
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::_::Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>&>
                     ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(params[4] + 4));
  AVar3 = Vector<kj::_::(anonymous_namespace)::SiPair>::asPtr
                    ((Vector<kj::_::(anonymous_namespace)::SiPair> *)params);
  ::const((char (*) [4])_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (char (*) [7])AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (SiPair *)pHVar1;
  HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::
  find<kj::_::(anonymous_namespace)::SiPair,char_const(&)[4]>
            ((HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)local_40,AVar3,local_48)
  ;
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::_::(anonymous_namespace)::SiPair_&>::Maybe
              ((Maybe<kj::_::(anonymous_namespace)::SiPair_&> *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::_::(anonymous_namespace)::SiPair>::operator[]
                  ((Vector<kj::_::(anonymous_namespace)::SiPair> *)params,*puVar2);
    Maybe<kj::_::(anonymous_namespace)::SiPair_&>::Maybe
              ((Maybe<kj::_::(anonymous_namespace)::SiPair_&> *)this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}